

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O1

void __thiscall
wavingz::demod::state_machine::symbol_sm::payload_t::process
          (payload_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  bitset<8UL> *pbVar1;
  size_t sVar2;
  pointer *ppuVar3;
  bool bVar4;
  uchar uVar5;
  size_t sVar6;
  void *pvVar7;
  iterator __position;
  undefined8 *puVar8;
  pointer puVar9;
  ulong uVar10;
  pointer extraout_RDX;
  pointer local_18;
  pointer local_10;
  
  if ((symbol->super_type).m_initialized == false) {
    local_18 = (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_10 = (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (*(long *)(ctx + 0x10) == 0) {
      std::__throw_bad_function_call();
      (this->super_state_base_t)._vptr_state_base_t = (_func_int **)ctx;
      (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = extraout_RDX;
      puVar9 = (pointer)operator_new(8);
      *(undefined ***)puVar9 = &PTR_process_0011bd08;
      (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9;
      return;
    }
    (**(code **)(ctx + 0x18))(ctx,&local_18,&local_10);
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    *puVar8 = &PTR_process_0011bbe8;
    puVar8[1] = 0;
    pvVar7 = *(void **)(ctx + 0x20);
    *(undefined8 **)(ctx + 0x20) = puVar8;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7);
    }
  }
  else {
    bVar4 = (symbol->super_type).m_storage;
    pbVar1 = &this->b;
    sVar6 = this->cnt;
    sVar2 = sVar6 + 1;
    this->cnt = sVar2;
    uVar10 = 1L << (7U - (char)sVar6 & 0x3f);
    if (bVar4 == true) {
      uVar10 = uVar10 | (pbVar1->super__Base_bitset<1UL>)._M_w;
    }
    else {
      uVar10 = ~uVar10 & (pbVar1->super__Base_bitset<1UL>)._M_w;
    }
    (pbVar1->super__Base_bitset<1UL>)._M_w = uVar10;
    if (sVar2 == 8) {
      uVar5 = (uchar)(this->b).super__Base_bitset<1UL>._M_w;
      local_18 = (pointer)CONCAT71(local_18._1_7_,uVar5);
      __position._M_current =
           (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&this->payload,__position,(uchar *)&local_18);
      }
      else {
        *__position._M_current = uVar5;
        ppuVar3 = &(this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      (pbVar1->super__Base_bitset<1UL>)._M_w = 0;
      this->cnt = 0;
    }
  }
  return;
}

Assistant:

void
payload_t::process(symbol_sm_t& ctx, const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.callback(payload.data(), payload.data() + payload.size());
        ctx.state(
            std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else
    {
        b[7 - cnt++] = *symbol;
        if (cnt == b.size())
        {
            payload.push_back(uint8_t(b.to_ulong()));
            b.reset();
            cnt = 0;
        }
    }
}